

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

matroska_cuepoint * MATROSKA_CuesGetTimestampStart(ebml_element *Cues,mkv_timestamp_t Timestamp)

{
  ebml_context *Context;
  bool_t bVar1;
  mkv_timestamp_t mVar2;
  matroska_cuepoint *pmVar3;
  matroska_cuepoint *pmVar4;
  
  if (Cues == (ebml_element *)0x0) {
    __assert_fail("Cues!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x88c,
                  "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                 );
  }
  Context = MATROSKA_getContextCues();
  bVar1 = EBML_ElementIsType(Cues,Context);
  if (bVar1 == 0) {
    __assert_fail("EBML_ElementIsType(Cues, MATROSKA_getContextCues())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x88d,
                  "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                 );
  }
  if (Timestamp == 0x7fffffffffffffff) {
    pmVar3 = (matroska_cuepoint *)0x0;
  }
  else {
    pmVar3 = (matroska_cuepoint *)(Cues->Base).Children;
    if (pmVar3 != (matroska_cuepoint *)0x0) {
      mVar2 = MATROSKA_CueTimestamp(pmVar3);
      if (Timestamp < mVar2) {
        pmVar4 = (matroska_cuepoint *)0x0;
      }
      else {
        do {
          pmVar4 = pmVar3;
          pmVar3 = (matroska_cuepoint *)(pmVar4->Base).Base.Base.Next;
          if (pmVar4 == pmVar3) {
            __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x891,
                          "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                         );
          }
          if (pmVar3 == (matroska_cuepoint *)0x0) {
            return pmVar4;
          }
          mVar2 = MATROSKA_CueTimestamp(pmVar3);
        } while (mVar2 <= Timestamp);
      }
      if (pmVar4 != (matroska_cuepoint *)0x0) {
        return pmVar4;
      }
    }
    pmVar3 = (matroska_cuepoint *)(Cues->Base).Children;
  }
  return pmVar3;
}

Assistant:

matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *Cues, mkv_timestamp_t Timestamp)
{
    matroska_cuepoint *Elt,*Prev=NULL;

    assert(Cues!=NULL);
    assert(EBML_ElementIsType(Cues, MATROSKA_getContextCues()));
    if (Timestamp==INVALID_TIMESTAMP_T)
        return NULL;

    for (Elt=(matroska_cuepoint*)EBML_MasterChildren(Cues);Elt;Prev=Elt, Elt=(matroska_cuepoint*)EBML_MasterNext(Elt))
    {
        if (MATROSKA_CueTimestamp(Elt) > Timestamp)
            break;
    }

    return Prev ? Prev : (matroska_cuepoint*)EBML_MasterChildren(Cues);
}